

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O3

QString * __thiscall
QWidgetLineControl::maskString
          (QString *__return_storage_ptr__,QWidgetLineControl *this,int pos,QString *str,bool clear)

{
  QChar key;
  int iVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  CutResult CVar5;
  uint uVar6;
  char16_t *pcVar7;
  QChar QVar8;
  wchar32 wVar9;
  uint uVar10;
  ulong uVar11;
  QArrayData *pQVar12;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QString *s;
  QString local_70;
  QString local_58;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pos < *(int *)(this + 0x60)) {
    local_58.d.d = (Data *)0x0;
    local_58.d.ptr = (char16_t *)0x0;
    local_58.d.size = 0;
    if (clear) {
      clearString(&local_70,this,0,*(int *)(this + 0x60));
    }
    else {
      local_70.d.d = *(Data **)(this + 0x18);
      local_70.d.ptr = *(char16_t **)(this + 0x20);
      local_70.d.size = *(qsizetype *)(this + 0x28);
      if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    QString::operator=(&local_58,(QString *)&local_70);
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    uVar10 = 0;
    QVar14.m_data = (storage_type *)0x0;
    QVar14.m_size = (qsizetype)__return_storage_ptr__;
    QString::fromLatin1(QVar14);
    if (pos < *(int *)(this + 0x60)) {
      do {
        uVar11 = (ulong)uVar10;
        if ((ulong)(str->d).size <= uVar11) break;
        lVar2 = *(long *)(this + 0xe8);
        if (lVar2 == 0) {
          maskString();
LAB_004254d6:
          maskString();
LAB_004254db:
          maskString();
LAB_004254e0:
          maskString();
          goto LAB_004254e5;
        }
        pQVar12 = (QArrayData *)(long)pos;
        QVar8.ucs = (char16_t)__return_storage_ptr__;
        if (*(char *)(lVar2 + 2 + (long)pQVar12 * 8) == '\x01') {
          QString::append(QVar8);
          if (*(long *)(this + 0xe8) == 0) goto LAB_004254d6;
          uVar6 = (uint)((str->d).ptr[uVar11] ==
                        *(char16_t *)(*(long *)(this + 0xe8) + (long)pQVar12 * 8));
          pos = pos + 1;
        }
        else {
          key.ucs = (str->d).ptr[uVar11];
          bVar3 = isValidInput(this,key,(QChar)(char16_t)*(undefined4 *)(lVar2 + (long)pQVar12 * 8))
          ;
          if (bVar3) {
            iVar4 = *(int *)(lVar2 + 4 + (long)pQVar12 * 8);
            if (iVar4 == 2) {
              QChar::toLower((uint)(ushort)key.ucs);
            }
            else if (iVar4 == 1) {
              QChar::toUpper((uint)(ushort)key.ucs);
            }
            QString::append(QVar8);
            pos = pos + 1;
            goto LAB_00425479;
          }
          iVar4 = findInMask(this,pos,true,true,key);
          pcVar7 = local_58.d.ptr;
          if (iVar4 == -1) {
            iVar4 = findInMask(this,pos,true,false,(QChar)(str->d).ptr[uVar11]);
            pcVar7 = local_58.d.ptr;
            if (iVar4 == -1) goto LAB_00425479;
            local_40 = (long)(iVar4 - pos);
            local_70.d.d = (Data *)pQVar12;
            CVar5 = QtPrivate::QContainerImplHelper::mid
                              (local_58.d.size,(qsizetype *)&local_70,&local_40);
            if (CVar5 == Null) {
              pcVar7 = (char16_t *)0x0;
            }
            else {
              pcVar7 = pcVar7 + (long)local_70.d.d;
            }
            QString::append((QChar *)__return_storage_ptr__,(longlong)pcVar7);
            if (*(long *)(this + 0xe8) != 0) {
              iVar1 = *(int *)(*(long *)(this + 0xe8) + 4 + (long)iVar4 * 8);
              wVar9 = (wchar32)(ushort)(str->d).ptr[uVar11];
              if (iVar1 == 2) {
                QChar::toLower(wVar9);
              }
              else if (iVar1 == 1) {
                QChar::toUpper(wVar9);
              }
              QString::append(QVar8);
              goto LAB_00425476;
            }
            goto LAB_004254db;
          }
          if ((pos == 0) || ((str->d).size != 1)) {
LAB_00425328:
            local_40 = (long)((iVar4 - pos) + 1);
            local_70.d.d = (Data *)pQVar12;
            CVar5 = QtPrivate::QContainerImplHelper::mid
                              (local_58.d.size,(qsizetype *)&local_70,&local_40);
            if (CVar5 == Null) {
              pcVar7 = (char16_t *)0x0;
            }
            else {
              pcVar7 = pcVar7 + (long)local_70.d.d;
            }
            QString::append((QChar *)__return_storage_ptr__,(longlong)pcVar7);
LAB_00425476:
            pos = iVar4 + 1;
          }
          else if (0 < pos) {
            lVar2 = *(long *)(this + 0xe8);
            if (lVar2 == 0) goto LAB_004254e0;
            if ((*(char *)(lVar2 + -6 + (ulong)(uint)pos * 8) != '\x01') ||
               (*(char16_t *)(lVar2 + -8 + (ulong)(uint)pos * 8) != (str->d).ptr[uVar11]))
            goto LAB_00425328;
          }
LAB_00425479:
          uVar6 = 1;
        }
        uVar10 = uVar10 + uVar6;
      } while (pos < *(int *)(this + 0x60));
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_004254e5:
      __stack_chk_fail();
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_004254e5;
    QVar13.m_data = (storage_type *)0x0;
    QVar13.m_size = (qsizetype)__return_storage_ptr__;
    QString::fromLatin1(QVar13);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QWidgetLineControl::maskString(int pos, const QString &str, bool clear) const
{
    if (pos >= m_maxLength)
        return QString::fromLatin1("");

    QString fill;
    fill = clear ? clearString(0, m_maxLength) : m_text;

    int strIndex = 0;
    QString s = QString::fromLatin1("");
    int i = pos;
    while (i < m_maxLength) {
        if (strIndex < str.size()) {
            if (m_maskData[i].separator) {
                s += m_maskData[i].maskChar;
                if (str[strIndex] == m_maskData[i].maskChar)
                    strIndex++;
                ++i;
            } else {
                if (isValidInput(str[strIndex], m_maskData[i].maskChar)) {
                    switch (m_maskData[i].caseMode) {
                    case MaskInputData::Upper:
                        s += str[strIndex].toUpper();
                        break;
                    case MaskInputData::Lower:
                        s += str[strIndex].toLower();
                        break;
                    default:
                        s += str[strIndex];
                    }
                    ++i;
                } else {
                    // search for separator first
                    int n = findInMask(i, true, true, str[strIndex]);
                    if (n != -1) {
                        if (str.size() != 1 || i == 0 || (i > 0 && (!m_maskData[i-1].separator || m_maskData[i-1].maskChar != str[strIndex]))) {
                            s += QStringView{fill}.mid(i, n - i + 1);
                            i = n + 1; // update i to find + 1
                        }
                    } else {
                        // search for valid m_blank if not
                        n = findInMask(i, true, false, str[strIndex]);
                        if (n != -1) {
                            s += QStringView{fill}.mid(i, n - i);
                            switch (m_maskData[n].caseMode) {
                            case MaskInputData::Upper:
                                s += str[strIndex].toUpper();
                                break;
                            case MaskInputData::Lower:
                                s += str[strIndex].toLower();
                                break;
                            default:
                                s += str[strIndex];
                            }
                            i = n + 1; // updates i to find + 1
                        }
                    }
                }
                ++strIndex;
            }
        } else
            break;
    }

    return s;
}